

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::BuildPresetsHelper
          (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_R8;
  Object<cmCMakePresetsGraph::BuildPreset> OStack_38;
  
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::BuildPreset>::Object
                (&OStack_38,
                 (Object<cmCMakePresetsGraph::BuildPreset> *)
                 (anonymous_namespace)::BuildPresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&OStack_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member>_>
      ::~vector(&OStack_38.Members);
      __cxa_atexit(std::_Function_base::~_Function_base,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*)>
          ::operator()(&BuildPresetsHelper::helper,out,value);
  return RVar1;
}

Assistant:

ReadFileResult BuildPresetsHelper(std::vector<BuildPreset>& out,
                                  const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
    BuildPresetHelper);

  return helper(out, value);
}